

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferStreambuf.hh
# Opt level: O0

streamsize __thiscall avro::istreambuf::showmanyc(istreambuf *this)

{
  long lVar1;
  long lVar2;
  istreambuf *in_stack_00000010;
  
  lVar1 = std::streambuf::egptr();
  lVar2 = std::streambuf::gptr();
  if (lVar1 == lVar2) {
    underflow(in_stack_00000010);
  }
  lVar1 = std::streambuf::egptr();
  lVar2 = std::streambuf::gptr();
  return lVar1 - lVar2;
}

Assistant:

virtual std::streamsize showmanyc() {

        // this function only gets called when the current buffer has been
        // completely read, verify this is the case, and if so, underflow to
        // fetch the next buffer

        if(egptr() - gptr() == 0) {
            istreambuf::underflow();
        }
        return egptr() - gptr();
    }